

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetPipelineState
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IPipelineState *pPipelineState,
          INTERFACE_ID *IID_PSOImpl)

{
  DeviceContextCommandCounters *pDVar1;
  ulong uVar2;
  COMMAND_QUEUE_TYPE CVar3;
  DeviceContextIndex DVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  INTERFACE_ID *extraout_RDX;
  INTERFACE_ID *pIVar7;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  RefCntAutoPtr<Diligent::PipelineStateGLImpl> pPipelineStateImpl;
  char (*in_stack_ffffffffffffff88) [3];
  string local_70;
  String local_50;
  
  if (pPipelineState == (IPipelineState *)0x0) {
    FormatString<char[32]>(&local_70,(char (*) [32])"Pipeline state must not be null");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x308);
    std::__cxx11::string::~string((string *)&local_70);
    bVar5 = false;
  }
  else {
    CVar3 = (this->m_Desc).QueueType;
    pIVar7 = IID_PSOImpl;
    if (CVar3 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_70,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"SetPipelineState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x30c);
        std::__cxx11::string::~string((string *)&local_70);
      }
      FormatString<char[97]>
                (&local_70,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      std::__cxx11::string::~string((string *)&local_70);
      CVar3 = (this->m_Desc).QueueType;
      pIVar7 = extraout_RDX;
    }
    if ((~CVar3 & 3) != 0) {
      GetCommandQueueTypeString_abi_cxx11_
                (&local_50,(Diligent *)(ulong)CVar3,(COMMAND_QUEUE_TYPE)pIVar7);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&local_70,(Diligent *)"SetPipelineState",(char (*) [17])0x2e3525,
                 (char (*) [22])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_50);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      std::__cxx11::string::~string((string *)&local_70);
    }
    iVar6 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])(pPipelineState);
    uVar2 = *(ulong *)(CONCAT44(extraout_var,iVar6) + 0x10);
    DVar4 = GetExecutionCtxId(this);
    if ((uVar2 >> ((ulong)DVar4.m_Value & 0x3f) & 1) == 0) {
      in_R8 = (char *)&this->m_Desc;
      iVar6 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])
                        (pPipelineState);
      FormatString<char[6],char_const*,char[36],char_const*,char[3]>
                (&local_70,(Diligent *)0x2b82c5,(char (*) [6])CONCAT44(extraout_var_00,iVar6),
                 (char **)"\' can\'t be used in device context \'",(char (*) [36])in_R8,
                 (char **)"\'.",in_stack_ffffffffffffff88);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30f);
      std::__cxx11::string::~string((string *)&local_70);
    }
    iVar6 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[0x15])
                      (pPipelineState,0);
    if (iVar6 != 2) {
      iVar6 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])
                        (pPipelineState);
      FormatString<char[6],char_const*,char[62]>
                (&local_70,(Diligent *)0x2b82c5,(char (*) [6])CONCAT44(extraout_var_01,iVar6),
                 (char **)"\' is not ready. Use GetStatus() to check the pipeline status.",
                 (char (*) [62])in_R8);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x313);
      std::__cxx11::string::~string((string *)&local_70);
    }
    RefCntAutoPtr<Diligent::PipelineStateGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::PipelineStateGLImpl> *)&local_50,(IObject *)pPipelineState,
               IID_PSOImpl);
    if ((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
         *)local_50._M_dataplus._M_p ==
        (DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
         *)0x0) {
      FormatString<char[45]>
                (&local_70,(char (*) [45])"Unknown pipeline state object implementation");
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x318);
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar5 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::IsSameObject((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                            *)(this->m_pPipelineState).m_pObject,
                           (DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                            *)local_50._M_dataplus._M_p);
    if (!bVar5) {
      RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator=
                (&this->m_pPipelineState,(RefCntAutoPtr<Diligent::PipelineStateGLImpl> *)&local_50);
      pDVar1 = &(this->m_Stats).CommandCounters;
      pDVar1->SetPipelineState = pDVar1->SetPipelineState + 1;
    }
    bVar5 = !bVar5;
    RefCntAutoPtr<Diligent::PipelineStateGLImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineStateGLImpl> *)&local_50);
  }
  return bVar5;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetPipelineState(
    IPipelineState*     pPipelineState,
    const INTERFACE_ID& IID_PSOImpl)
{
    if (pPipelineState == nullptr)
    {
        DEV_ERROR("Pipeline state must not be null");
        return false;
    }

    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "SetPipelineState");

    DEV_CHECK_ERR((pPipelineState->GetDesc().ImmediateContextMask & (Uint64{1} << GetExecutionCtxId())) != 0,
                  "PSO '", pPipelineState->GetDesc().Name, "' can't be used in device context '", m_Desc.Name, "'.");

    // Check that the PSO is ready before querying the implementation.
    DEV_CHECK_ERR(pPipelineState->GetStatus() == PIPELINE_STATE_STATUS_READY, "PSO '", pPipelineState->GetDesc().Name,
                  "' is not ready. Use GetStatus() to check the pipeline status.");

    // Note that pPipelineStateImpl may not be the same as pPipelineState (for example, if pPipelineState
    // is a reloadable pipeline).
    RefCntAutoPtr<PipelineStateImplType> pPipelineStateImpl{pPipelineState, IID_PSOImpl};
    VERIFY(pPipelineStateImpl != nullptr, "Unknown pipeline state object implementation");
    if (PipelineStateImplType::IsSameObject(m_pPipelineState, pPipelineStateImpl))
        return false;

    m_pPipelineState = std::move(pPipelineStateImpl);
    ++m_Stats.CommandCounters.SetPipelineState;

    return true;
}